

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-inl.h
# Opt level: O0

bool wabt::interp::Extern::classof(Object *obj)

{
  ObjectKind OVar1;
  Object *obj_local;
  
  OVar1 = Object::kind(obj);
  return OVar1 - DefinedFunc < 6;
}

Assistant:

inline bool Extern::classof(const Object* obj) {
  switch (obj->kind()) {
    case ObjectKind::DefinedFunc:
    case ObjectKind::HostFunc:
    case ObjectKind::Table:
    case ObjectKind::Memory:
    case ObjectKind::Global:
    case ObjectKind::Event:
      return true;
    default:
      return false;
  }
}